

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O2

string * __thiscall
punky::ast::IfExpression::to_string_abi_cxx11_(string *__return_storage_ptr__,IfExpression *this)

{
  unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if (((this->m_condition)._M_t.
       super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
       super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
       super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl == (ExprNode *)0x0) ||
     ((this->m_consequence)._M_t.
      super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>._M_t
      .super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>.
      super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl == (BlockStmt *)0x0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&bStack_d8);
  }
  else {
    ExprNode::token_literal_abi_cxx11_(&local_38,&this->super_ExprNode);
    std::operator+(&local_58,&local_38," ");
    (*(((this->m_condition)._M_t.
        super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t
        .super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
        super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl)->super_AstNode).
      _vptr_AstNode[3])(&local_78);
    std::operator+(&local_b8,&local_58,&local_78);
    std::operator+(&bStack_d8,&local_b8," ");
    (**(code **)(*(long *)&(((this->m_consequence)._M_t.
                             super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
                             .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl)->
                           super_StmtNode).super_AstNode + 0x18))(&local_98);
    std::operator+(__return_storage_ptr__,&bStack_d8,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&bStack_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    if ((this->m_alternative).
        super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
        ._M_engaged == true) {
      puVar1 = std::
               optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
               ::value(&this->m_alternative);
      (**(code **)(*(long *)&(((puVar1->_M_t).
                               super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
                               .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl)
                             ->super_StmtNode).super_AstNode + 0x18))(&local_b8);
      std::operator+(&bStack_d8,"else ",&local_b8);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&bStack_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IfExpression::to_string() const
{
    if (m_condition && m_consequence)
    {
        std::string if_str{token_literal() + " " + m_condition->to_string()
                           + " " + m_consequence->to_string()};
        if (m_alternative.has_value())
            if_str.append("else " + m_alternative.value()->to_string());
        return if_str;
    }
    return "";
}